

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  size_t sVar1;
  Byte BVar2;
  char cVar3;
  Byte BVar4;
  SRes SVar5;
  SRes SVar6;
  uint uVar7;
  uint uVar8;
  size_t *psVar9;
  UInt32 *pUVar10;
  Byte *pBVar11;
  ulong uVar12;
  UInt64 *pUVar13;
  ulong uVar14;
  byte *pbVar15;
  ISzAlloc *alloc_00;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  UInt64 UVar19;
  uint uVar20;
  CSzAr *pCVar21;
  byte bVar22;
  UInt32 UVar23;
  uint uVar24;
  UInt64 *value;
  int iVar25;
  int iVar26;
  UInt64 *pUVar27;
  size_t sVar28;
  bool bVar29;
  CSzData sd_1;
  UInt32 index_1;
  UInt64 type;
  UInt32 numFolders;
  UInt32 numCoders;
  UInt64 packSize;
  UInt32 coderOutStreams;
  byte local_12d;
  CSzData local_118;
  undefined8 local_100;
  uint local_f4;
  ulong local_f0;
  CSzData *local_e8;
  ulong local_e0;
  UInt64 local_d8;
  uint local_d0;
  uint local_cc;
  UInt64 *local_c8;
  uint local_bc;
  UInt64 local_b8 [8];
  uint local_78 [18];
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar5 = ReadNumber(sd,&local_d8);
  if (SVar5 != 0) {
    return SVar5;
  }
  value = (UInt64 *)(ulong)numFoldersMax;
  if (local_d8 == 6) {
    SVar5 = ReadNumber(sd,dataOffset);
    if (SVar5 != 0) {
      return SVar5;
    }
    SVar6 = SzReadNumber32(sd,&p->NumPackStreams);
    SVar5 = SVar6;
    if ((SVar6 == 0) && (SVar5 = WaitId(sd,9), SVar5 == 0)) {
      pUVar13 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)p->NumPackStreams * 8 + 8);
      p->PackPositions = pUVar13;
      if (pUVar13 == (UInt64 *)0x0) {
        SVar5 = 2;
      }
      else {
        local_100 = (byte *)(ulong)p->NumPackStreams;
        bVar29 = local_100 != (byte *)0x0;
        if (local_100 == (byte *)0x0) {
          pbVar15 = (byte *)0x0;
          UVar19 = 0;
LAB_0010f58b:
          p->PackPositions[(long)pbVar15] = UVar19;
          SVar5 = SVar6;
        }
        else {
          *p->PackPositions = 0;
          SVar5 = ReadNumber(sd,local_b8);
          bVar29 = true;
          if (SVar5 == 0) {
            UVar19 = local_b8[0];
            pbVar17 = (byte *)0x1;
            do {
              pbVar15 = pbVar17;
              if (local_100 == pbVar15) {
                bVar29 = false;
                goto LAB_0010f58b;
              }
              p->PackPositions[(long)pbVar15] = UVar19;
              SVar5 = ReadNumber(sd,local_b8);
              if (SVar5 != 0) {
                SVar6 = 0;
              }
              UVar19 = UVar19 + local_b8[0];
              if (UVar19 < local_b8[0]) {
                SVar6 = 0x10;
              }
            } while ((SVar5 == 0) && (pbVar17 = pbVar15 + 1, SVar5 = SVar6, local_b8[0] <= UVar19));
            bVar29 = pbVar15 < local_100;
          }
        }
        if (!bVar29) {
          do {
            SVar6 = ReadNumber(sd,local_b8);
            bVar29 = true;
            if (SVar6 == 0) {
              if (local_b8[0] == 0) {
                SVar6 = 0;
              }
              else {
                if (local_b8[0] == 10) {
                  iVar26 = SkipBitUi32s(sd,p->NumPackStreams);
                }
                else {
                  iVar26 = SkipData(sd);
                }
                bVar29 = iVar26 != 0;
                SVar6 = SVar5;
                if (bVar29) {
                  SVar6 = iVar26;
                }
              }
            }
            SVar5 = SVar6;
          } while (!bVar29);
        }
      }
    }
    if (SVar5 != 0) {
      return SVar5;
    }
    SVar5 = ReadNumber(sd,&local_d8);
    if (SVar5 != 0) {
      return SVar5;
    }
  }
  if (local_d8 != 7) goto LAB_0010fc72;
  SVar6 = WaitId(sd,0xb);
  SVar5 = SVar6;
  if ((SVar6 == 0) && (SVar5 = SzReadNumber32(sd,&local_cc), uVar7 = local_cc, SVar5 == 0)) {
    pUVar13 = (UInt64 *)(ulong)local_cc;
    SVar5 = 4;
    if (local_cc <= numFoldersMax) {
      p->NumFolders = local_cc;
      SVar5 = 0x10;
      if (sd->Size != 0) {
        sd->Size = sd->Size - 1;
        pBVar11 = sd->Data;
        sd->Data = pBVar11 + 1;
        BVar2 = *pBVar11;
        value = (UInt64 *)(ulong)CONCAT31((int3)(numFoldersMax >> 8),BVar2);
        if (BVar2 == '\0') {
          local_118.Data = sd->Data;
          local_118.Size = sd->Size;
        }
        else {
          SVar5 = SzReadNumber32(sd,(UInt32 *)local_b8);
          if (SVar5 == 0) {
            if (numTempBufs <= (uint)local_b8[0]) {
              SVar5 = 0x10;
              goto LAB_0010f610;
            }
            local_118.Data = tempBufs[local_b8[0] & 0xffffffff].data;
            local_118.Size = tempBufs[local_b8[0] & 0xffffffff].size;
            bVar29 = true;
          }
          else {
LAB_0010f610:
            SVar6 = SVar5;
            bVar29 = false;
          }
          SVar5 = SVar6;
          if (!bVar29) goto LAB_0010fc45;
        }
        psVar9 = (size_t *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(long)pUVar13 * 8 + 8);
        p->FoCodersOffsets = psVar9;
        SVar5 = 2;
        if (psVar9 != (size_t *)0x0) {
          sVar1 = (long)pUVar13 * 4 + 4;
          pUVar10 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar1);
          p->FoStartPackStreamIndex = pUVar10;
          value = pUVar13;
          if (pUVar10 != (UInt32 *)0x0) {
            pUVar10 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar1);
            p->FoToCoderUnpackSizes = pUVar10;
            if (pUVar10 != (UInt32 *)0x0) {
              pBVar11 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)pUVar13);
              p->FoToMainUnpackSizeIndex = pBVar11;
              if (pBVar11 != (Byte *)0x0) {
                local_100 = local_118.Data;
                if (uVar7 == 0) {
                  uVar14 = 0;
                  value = (UInt64 *)0x0;
                  uVar18 = 0;
                }
                else {
                  pUVar27 = (UInt64 *)0x0;
                  local_e8 = (CSzData *)((ulong)local_e8 & 0xffffffff00000000);
                  local_e0 = 0;
                  SVar5 = SVar6;
                  do {
                    p->FoCodersOffsets[(long)pUVar27] = (long)local_118.Data - (long)local_100;
                    SVar6 = SzReadNumber32(&local_118,&local_bc);
                    if (SVar6 == 0) {
                      uVar14 = (ulong)local_bc;
                      sVar28 = 0;
                      if (0xffffffbf < local_bc - 0x41) {
                        uVar18 = uVar14;
                        if (local_bc != 0) {
                          sVar28 = 0;
                          local_f0 = uVar14;
                          do {
                            if (local_118.Size == 0) {
                              bVar29 = false;
                              SVar5 = 0x10;
                            }
                            else {
                              uVar12 = local_118.Size - 1;
                              pbVar15 = local_118.Data + 1;
                              bVar22 = *local_118.Data;
                              value = (UInt64 *)(ulong)bVar22;
                              local_118.Data = pbVar15;
                              if ((bVar22 < 0x40) &&
                                 (uVar7 = bVar22 & 0xf, uVar16 = (ulong)uVar7, uVar7 < 9)) {
                                local_118.Size = uVar12 - uVar16;
                                if (uVar12 < uVar16) {
                                  bVar29 = false;
                                  SVar5 = 0x10;
                                  local_118.Size = uVar12;
                                }
                                else {
                                  local_118.Data = pbVar15 + uVar16;
                                  local_b8[0] = CONCAT44(local_b8[0]._4_4_,1);
                                  if ((bVar22 & 0x10) != 0) {
                                    SVar6 = SzReadNumber32(&local_118,(UInt32 *)local_b8);
                                    if ((SVar6 == 0) &&
                                       (SVar6 = SzReadNumber32(&local_118,local_78), SVar6 == 0)) {
                                      bVar29 = local_78[0] == 1 && (uint)local_b8[0] < 0x41;
                                      if (local_78[0] != 1 || (uint)local_b8[0] >= 0x41) {
                                        SVar5 = 4;
                                      }
                                    }
                                    else {
                                      SVar5 = SVar6;
                                      bVar29 = false;
                                    }
                                    uVar18 = local_f0;
                                    if (!bVar29) {
                                      bVar29 = false;
                                      goto LAB_0010f78d;
                                    }
                                  }
                                  uVar7 = (int)sVar28 + (uint)local_b8[0];
                                  sVar28 = (size_t)uVar7;
                                  bVar29 = true;
                                  if (0x1f < bVar22) {
                                    SVar6 = SzReadNumber32(&local_118,local_78);
                                    if (SVar6 == 0) {
                                      uVar18 = (ulong)local_78[0];
                                      if (local_118.Size < uVar18) {
                                        SVar6 = 0x10;
                                        goto LAB_0010f85d;
                                      }
                                      local_118.Data = local_118.Data + uVar18;
                                      bVar29 = true;
                                      local_118.Size = local_118.Size - uVar18;
                                    }
                                    else {
LAB_0010f85d:
                                      SVar5 = SVar6;
                                      bVar29 = false;
                                    }
                                    sVar28 = (size_t)uVar7;
                                    uVar18 = local_f0;
                                  }
                                }
                              }
                              else {
                                bVar29 = false;
                                SVar5 = 4;
                                local_118.Size = uVar12;
                              }
                            }
LAB_0010f78d:
                            if (!bVar29) {
                              bVar29 = false;
                              goto LAB_0010f92e;
                            }
                            uVar7 = (int)uVar14 - 1;
                            uVar14 = (ulong)uVar7;
                          } while (uVar7 != 0);
                        }
                        uVar24 = (uint)uVar18;
                        uVar7 = (uint)sVar28;
                        if ((uVar24 == 1) && (uVar7 == 1)) {
                          BVar4 = '\0';
                          uVar7 = 1;
                        }
                        else {
                          uVar20 = uVar24 - 1;
                          if (uVar7 < uVar20) {
                            SVar5 = 0x10;
LAB_0010f8ea:
                            BVar4 = '\0';
                            bVar29 = false;
                            uVar7 = 1;
                          }
                          else {
                            if (0x40 < uVar7) {
                              SVar5 = 4;
                              goto LAB_0010f8ea;
                            }
                            local_d0 = uVar7 - uVar20;
                            local_c8 = pUVar13;
                            if (uVar7 != 0) {
                              memset(local_b8,0,sVar28);
                            }
                            if (uVar24 != 0) {
                              memset(local_78,0,uVar18);
                            }
                            if (uVar20 != 0) {
                              value = (UInt64 *)0x1;
                              do {
                                SVar6 = SzReadNumber32(&local_118,&local_f4);
                                if (SVar6 == 0) {
                                  if ((local_f4 < uVar7) &&
                                     (*(char *)((long)local_b8 + (ulong)local_f4) == '\0')) {
                                    *(undefined1 *)((long)local_b8 + (ulong)local_f4) = 1;
                                    SVar6 = SzReadNumber32(&local_118,&local_f4);
                                    if (SVar6 != 0) goto LAB_0010f9d9;
                                    if (uVar24 <= local_f4) goto LAB_0010f9ef;
                                    cVar3 = *(char *)((long)local_78 + (ulong)local_f4);
                                    bVar29 = cVar3 == '\0';
                                    *(char *)((long)local_78 + (ulong)local_f4) =
                                         cVar3 + (cVar3 == '\0');
                                    if (!bVar29) {
                                      SVar5 = 0x10;
                                    }
                                  }
                                  else {
LAB_0010f9ef:
                                    bVar29 = false;
                                    SVar5 = 0x10;
                                  }
                                }
                                else {
LAB_0010f9d9:
                                  SVar5 = SVar6;
                                  bVar29 = false;
                                }
                                if (!bVar29) {
                                  BVar4 = '\0';
                                  bVar29 = false;
                                  pUVar13 = local_c8;
                                  uVar7 = 1;
                                  goto LAB_0010f8f9;
                                }
                                uVar8 = (int)value + 1;
                                value = (UInt64 *)(ulong)uVar8;
                              } while (uVar24 != uVar8);
                            }
                            if (1 < local_d0) {
                              do {
                                SVar6 = SzReadNumber32(&local_118,&local_f4);
                                if (SVar6 == 0) {
                                  if (local_f4 < uVar7) {
                                    cVar3 = *(char *)((long)local_b8 + (ulong)local_f4);
                                    bVar29 = cVar3 == '\0';
                                    *(char *)((long)local_b8 + (ulong)local_f4) =
                                         cVar3 + (cVar3 == '\0');
                                    if (!bVar29) {
                                      SVar5 = 0x10;
                                    }
                                  }
                                  else {
                                    SVar5 = 0x10;
                                    bVar29 = false;
                                  }
                                }
                                else {
                                  bVar29 = false;
                                  SVar5 = SVar6;
                                }
                                if (!bVar29) {
                                  BVar4 = '\0';
                                  bVar29 = false;
                                  pUVar13 = local_c8;
                                  uVar7 = local_d0;
                                  goto LAB_0010f8f9;
                                }
                                uVar20 = uVar20 + 1;
                              } while (uVar7 != uVar20);
                            }
                            uVar14 = 0;
                            if (uVar24 == 0) {
                              BVar4 = '\0';
                            }
                            else {
                              do {
                                if (*(char *)((long)local_78 + uVar14) == '\0') {
                                  BVar4 = (Byte)uVar14;
                                  goto LAB_0010fb1c;
                                }
                                uVar14 = uVar14 + 1;
                              } while (uVar18 != uVar14);
                              BVar4 = '\0';
                              uVar14 = uVar18 & 0xffffffff;
                            }
LAB_0010fb1c:
                            bVar29 = (uint)uVar14 != uVar24;
                            pUVar13 = local_c8;
                            uVar7 = local_d0;
                            if (!bVar29) {
                              SVar5 = 0x10;
                            }
                          }
LAB_0010f8f9:
                          if (!bVar29) {
                            bVar29 = false;
                            goto LAB_0010f92e;
                          }
                        }
                        UVar23 = (UInt32)local_e0;
                        p->FoStartPackStreamIndex[(long)pUVar27] = UVar23;
                        p->FoToCoderUnpackSizes[(long)pUVar27] = (uint)local_e8;
                        p->FoToMainUnpackSizeIndex[(long)pUVar27] = BVar4;
                        if (!CARRY4(uVar24,(uint)local_e8)) {
                          bVar29 = uVar7 <= p->NumPackStreams - UVar23;
                          if (bVar29) {
                            local_e0 = (ulong)(UVar23 + uVar7);
                          }
                          else {
                            SVar5 = 0x10;
                          }
                          local_e8 = (CSzData *)CONCAT44(local_e8._4_4_,uVar24 + (uint)local_e8);
                          goto LAB_0010f92e;
                        }
                        local_e8 = (CSzData *)CONCAT44(local_e8._4_4_,uVar24 + (uint)local_e8);
                      }
                      bVar29 = false;
                      SVar5 = 4;
                    }
                    else {
                      bVar29 = false;
                      SVar5 = SVar6;
                    }
LAB_0010f92e:
                    if (!bVar29) goto LAB_0010fc45;
                    pUVar27 = (UInt64 *)((long)pUVar27 + 1);
                  } while (pUVar27 != pUVar13);
                  uVar18 = (ulong)pUVar27 & 0xffffffff;
                  value = (UInt64 *)((ulong)local_e8 & 0xffffffff);
                  uVar14 = local_e0;
                  SVar6 = SVar5;
                }
                UVar23 = (UInt32)value;
                p->FoToCoderUnpackSizes[uVar18] = UVar23;
                p->FoStartPackStreamIndex[uVar18] = (UInt32)uVar14;
                psVar9 = p->FoCodersOffsets;
                bVar29 = true;
                sVar28 = (long)local_118.Data - (long)local_100;
                psVar9[uVar18] = sVar28;
                if (sVar28 == 0) {
                  pCVar21 = (CSzAr *)0x0;
                }
                else {
                  pBVar11 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar28);
                  p->CodersData = pBVar11;
                  pCVar21 = p;
                  if (pBVar11 == (Byte *)0x0) {
                    SVar6 = 2;
                    bVar29 = false;
                  }
                  else {
                    memcpy(pBVar11,local_100,sVar28);
                  }
                }
                SVar5 = SVar6;
                if (bVar29) {
                  if (BVar2 != '\0') {
                    SVar5 = 0x10;
                    if (local_118.Size != 0) goto LAB_0010fc45;
                    local_118.Data = sd->Data;
                    local_118.Size = sd->Size;
                  }
                  SVar5 = WaitId(&local_118,0xc);
                  if (SVar5 == 0) {
                    if (UVar23 == 0) {
                      pCVar21->CoderUnpackSizes = (UInt64 *)0x0;
                    }
                    else {
                      pUVar13 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(long)value * 8);
                      pCVar21->CoderUnpackSizes = pUVar13;
                      SVar5 = 2;
                      if (pUVar13 == (UInt64 *)0x0) goto LAB_0010fc45;
                    }
                    alloc_00 = (ISzAlloc *)CONCAT71((int7)((ulong)psVar9 >> 8),UVar23 != 0);
                    SVar5 = SVar6;
                    if (UVar23 != 0) {
                      SVar5 = ReadNumber(&local_118,pCVar21->CoderUnpackSizes);
                      alloc_00 = (ISzAlloc *)CONCAT71((int7)((ulong)alloc_00 >> 8),1);
                      if (SVar5 == 0) {
                        pUVar13 = (UInt64 *)0x0;
                        do {
                          pUVar13 = (UInt64 *)((long)pUVar13 + 1);
                          SVar5 = SVar6;
                          if (pUVar13 == value) break;
                          SVar5 = ReadNumber(&local_118,pCVar21->CoderUnpackSizes + (long)pUVar13);
                        } while (SVar5 == 0);
                        alloc_00 = (ISzAlloc *)
                                   CONCAT71((int7)((ulong)alloc_00 >> 8),pUVar13 < value);
                      }
                    }
                    if ((char)alloc_00 == '\0') {
                      value = local_b8;
                      do {
                        SVar6 = ReadNumber(&local_118,value);
                        if (SVar6 == 0) {
                          if (local_b8[0] == 10) {
                            SVar6 = ReadBitUi32s(&local_118,local_cc,&pCVar21->FolderCRCs,alloc_00);
                            bVar29 = SVar6 == 0;
                            alloc_00 = (ISzAlloc *)0x1;
                            if (bVar29) {
                              alloc_00 = (ISzAlloc *)0x1b;
                            }
                          }
                          else {
                            if (local_b8[0] == 0) {
                              sd->Data = local_118.Data;
                              sd->Size = local_118.Size;
                              SVar6 = 0;
                              goto LAB_001100f6;
                            }
                            SVar6 = SkipData(&local_118);
                            bVar29 = SVar6 == 0;
                            alloc_00 = (ISzAlloc *)(ulong)!bVar29;
                          }
                          if (!bVar29) {
                            SVar5 = SVar6;
                          }
                        }
                        else {
LAB_001100f6:
                          alloc_00 = (ISzAlloc *)0x1;
                          SVar5 = SVar6;
                        }
                      } while (((int)alloc_00 == 0) || ((int)alloc_00 == 0x1b));
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010fc45:
  if (SVar5 != 0) {
    return SVar5;
  }
  SVar5 = ReadNumber(sd,&local_d8);
  if (SVar5 != 0) {
    return SVar5;
  }
LAB_0010fc72:
  if (local_d8 != 8) {
    ssi->NumTotalSubStreams = p->NumFolders;
LAB_0010fe51:
    return (uint)(local_d8 != 0) << 2;
  }
  local_e8 = &ssi->sdNumSubStreams;
  local_b8[0] = 0;
  UVar23 = p->NumFolders;
  local_e0 = CONCAT71(local_e0._1_7_,UVar23 != 0);
  iVar26 = 0;
  local_f0 = CONCAT44(local_f0._4_4_,UVar23);
  local_100 = (byte *)((ulong)local_100 & 0xffffffff00000000);
LAB_0010fcc7:
  uVar7 = ReadNumber(sd,local_b8);
  value = (UInt64 *)((ulong)value & 0xffffffff);
  if (uVar7 != 0) {
    value = (UInt64 *)(ulong)uVar7;
  }
  iVar25 = (int)value;
  if (uVar7 != 0) goto LAB_00110037;
  uVar7 = (uint)local_f0;
  if ((1 < local_b8[0] - 9) && (local_b8[0] != 0)) {
    if (local_b8[0] != 0xd) {
      uVar7 = SkipData(sd);
      if (uVar7 != 0) {
        value = (UInt64 *)(ulong)uVar7;
      }
      iVar25 = (int)value;
      if (uVar7 != 0) goto LAB_00110037;
      goto LAB_0010fcc7;
    }
    local_e8->Data = sd->Data;
    if ((uint)local_f0 == 0) {
      UVar23 = 0;
      local_100 = (byte *)((ulong)local_100._4_4_ << 0x20);
      local_12d = (byte)local_e0;
    }
    else {
      local_100 = (byte *)((ulong)local_100._4_4_ << 0x20);
      local_12d = (byte)local_e0;
      uVar20 = 0;
      uVar24 = 0;
      do {
        uVar8 = SzReadNumber32(sd,local_78);
        if (uVar8 == 0) {
          UVar23 = local_78[0] + uVar24;
          if (CARRY4(local_78[0],uVar24)) {
            value = (UInt64 *)0x4;
            goto LAB_0010fd83;
          }
          iVar25 = local_78[0] - 1;
          if (local_78[0] == 0) {
            iVar25 = 0;
          }
          iVar26 = iVar25 + iVar26;
          if (((local_78[0] != 1) || (pBVar11 = (p->FolderCRCs).Defs, pBVar11 == (Byte *)0x0)) ||
             (bVar29 = true, -1 < (char)(pBVar11[uVar20 >> 3] << ((byte)uVar20 & 7)))) {
            local_100 = (byte *)CONCAT44(local_100._4_4_,(UInt32)local_100 + local_78[0]);
            bVar29 = true;
          }
        }
        else {
          value = (UInt64 *)(ulong)uVar8;
LAB_0010fd83:
          bVar29 = false;
          UVar23 = uVar24;
        }
        if (!bVar29) goto LAB_0010fe2a;
        uVar20 = uVar20 + 1;
        local_12d = uVar20 < uVar7;
        uVar24 = UVar23;
      } while (uVar20 != uVar7);
    }
    (ssi->sdNumSubStreams).Size = (long)sd->Data - (long)(ssi->sdNumSubStreams).Data;
LAB_0010fe2a:
    iVar25 = (int)value;
    if ((local_12d & 1) != 0) goto LAB_00110037;
    goto LAB_0010fcc7;
  }
  if (local_e8->Data == (Byte *)0x0) {
    pbVar15 = (p->FolderCRCs).Defs;
    if (pbVar15 == (byte *)0x0) {
      local_100 = (byte *)CONCAT44(local_100._4_4_,(uint)local_f0);
    }
    else {
      iVar25 = 0;
      if ((uint)local_f0 != 0) {
        uVar24 = 0;
        bVar22 = 0;
        do {
          if (uVar24 == 0) {
            bVar22 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            uVar24 = 8;
          }
          uVar24 = uVar24 - 1;
          iVar25 = iVar25 + (uint)((bVar22 >> (uVar24 & 0x1f) & 1) != 0);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      local_100 = (byte *)CONCAT44(local_100._4_4_,(uint)local_f0 - iVar25);
    }
  }
  ssi->NumTotalSubStreams = UVar23;
  ssi->NumSubDigests = (UInt32)local_100;
  if (local_b8[0] == 9) {
    (ssi->sdSizes).Data = sd->Data;
    pbVar15 = sd->Data;
    uVar14 = sd->Size;
    uVar18 = uVar14;
    pbVar17 = pbVar15;
    if (iVar26 != 0) {
      do {
        bVar29 = true;
        if (uVar18 == 0) {
          uVar14 = 0;
          pbVar15 = pbVar17;
        }
        else {
          uVar14 = uVar18 - 1;
          pbVar15 = pbVar17 + 1;
          bVar22 = *pbVar17;
          if ((char)bVar22 < '\0') {
            if ((bVar22 & 0x40) == 0) {
              if (uVar14 != 0) {
                uVar14 = uVar18 - 2;
                pbVar15 = pbVar17 + 2;
                goto LAB_0010ff13;
              }
              uVar14 = 0;
            }
            else {
              uVar18 = 2;
              if ((bVar22 & 0x20) != 0) {
                uVar7 = 0x20;
                uVar12 = uVar18;
                do {
                  uVar18 = uVar12 + 1;
                  if (6 < (uint)uVar12) break;
                  uVar7 = uVar7 >> 1;
                  uVar12 = uVar18;
                } while ((uVar7 & bVar22) != 0);
              }
              if (uVar18 <= uVar14) {
                pbVar15 = pbVar15 + uVar18;
                bVar29 = false;
                uVar14 = uVar14 - uVar18;
              }
            }
          }
          else {
LAB_0010ff13:
            bVar29 = false;
          }
        }
        if (bVar29) {
          uVar7 = 0x10;
          bVar29 = false;
          goto LAB_0010ff95;
        }
        iVar26 = iVar26 + -1;
        uVar18 = uVar14;
        pbVar17 = pbVar15;
        if (iVar26 == 0) break;
      } while( true );
    }
    sd->Data = pbVar15;
    sd->Size = uVar14;
    uVar7 = 0;
    bVar29 = true;
LAB_0010ff95:
    if (!bVar29) {
      value = (UInt64 *)(ulong)uVar7;
    }
    iVar25 = (int)value;
    if (bVar29) {
      (ssi->sdSizes).Size = (long)sd->Data - (long)(ssi->sdSizes).Data;
      uVar7 = ReadNumber(sd,local_b8);
      if (uVar7 != 0) {
        value = (UInt64 *)(ulong)uVar7;
      }
      iVar25 = (int)value;
      if (uVar7 == 0) goto LAB_0010ffc7;
    }
  }
  else {
LAB_0010ffc7:
    do {
      if (local_b8[0] != 10) {
        if (local_b8[0] == 0) {
          iVar25 = 0;
        }
        else {
          uVar7 = SkipData(sd);
          if (uVar7 != 0) {
            value = (UInt64 *)(ulong)uVar7;
          }
          iVar25 = (int)value;
          if (uVar7 == 0) goto LAB_0011001f;
        }
        break;
      }
      (ssi->sdCRCs).Data = sd->Data;
      uVar7 = SkipBitUi32s(sd,(UInt32)local_100);
      if (uVar7 != 0) {
        value = (UInt64 *)(ulong)uVar7;
      }
      iVar25 = (int)value;
      if (uVar7 != 0) break;
      (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
LAB_0011001f:
      uVar7 = ReadNumber(sd,local_b8);
      if (uVar7 != 0) {
        value = (UInt64 *)(ulong)uVar7;
      }
      iVar25 = (int)value;
    } while (uVar7 == 0);
  }
LAB_00110037:
  if (iVar25 != 0) {
    return iVar25;
  }
  SVar5 = ReadNumber(sd,&local_d8);
  if (SVar5 != 0) {
    return SVar5;
  }
  goto LAB_0010fe51;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    /* ssi->NumSubDigests = 0; */
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}